

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O1

void __thiscall StackSym::VerifyConstFlags(StackSym *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *message;
  char *error;
  uint lineNumber;
  
  uVar1 = *(uint *)&this->field_0x18;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xc1,"(!m_isIntConst)","!m_isIntConst");
      if (!bVar3) goto LAB_00631f31;
      *puVar4 = 0;
    }
    if ((this->field_0x18 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xc2,"(!m_isTaggableIntConst)","!m_isTaggableIntConst");
      if (!bVar3) goto LAB_00631f31;
      *puVar4 = 0;
    }
    if ((this->field_0x19 & 1) == 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    error = "(!m_isFltConst)";
    message = "!m_isFltConst";
    lineNumber = 0xc3;
  }
  else {
    if ((uVar1 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xb4,"(this->m_isSingleDef)","this->m_isSingleDef");
      if (!bVar3) goto LAB_00631f31;
      *puVar4 = 0;
    }
    if ((this->field_5).m_instrDef == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0xb5,"(this->m_instrDef)","this->m_instrDef");
      if (!bVar3) goto LAB_00631f31;
      *puVar4 = 0;
    }
    uVar1 = *(uint *)&this->field_0x18;
    if ((uVar1 & 0x10) == 0) {
      if ((uVar1 & 0x20) == 0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = "(!m_isTaggableIntConst)";
      message = "!m_isTaggableIntConst";
      lineNumber = 0xbc;
    }
    else {
      if ((uVar1 >> 8 & 1) == 0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      error = "(!m_isFltConst)";
      message = "!m_isFltConst";
      lineNumber = 0xb8;
    }
  }
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                     ,lineNumber,error,message);
  if (bVar3) {
    *puVar4 = 0;
    return;
  }
LAB_00631f31:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void
StackSym::VerifyConstFlags() const
{
    if (m_isConst)
    {
        Assert(this->m_isSingleDef);
        Assert(this->m_instrDef);
        if (m_isIntConst)
        {
            Assert(!m_isFltConst);
        }
        else
        {
            Assert(!m_isTaggableIntConst);
        }
    }
    else
    {
        Assert(!m_isIntConst);
        Assert(!m_isTaggableIntConst);
        Assert(!m_isFltConst);
    }
}